

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase83::run(TestCase83 *this)

{
  Reader reader;
  ClientHook *pCVar1;
  PromiseNode *pPVar2;
  long *plVar3;
  Server *pSVar4;
  CapTableBuilder *pCVar5;
  undefined8 uVar6;
  Disposer *pDVar7;
  RequestHook *pRVar8;
  SegmentReader *pSVar9;
  WirePointer *pWVar10;
  int iVar11;
  SegmentReader *pSVar12;
  WirePointer *pWVar13;
  int iVar14;
  int iVar15;
  pointer_____offset_0x10___ __n;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  Own<capnp::ClientHook> OVar16;
  Reader RVar17;
  int callCount;
  Client client1;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  Client client2;
  WaitScope waitScope;
  Client client;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> promise2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  request2;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  EventLoop loop;
  int local_264;
  pointer_____offset_0x10___ *local_260;
  Client local_258;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_248;
  WirePointer *local_230;
  short local_224;
  int local_220;
  undefined8 *local_218;
  long *local_210;
  pointer_____offset_0x10___ *local_208;
  undefined8 *local_200;
  long *local_1f8;
  EventLoop *local_1f0;
  undefined4 local_1e8;
  undefined1 local_1e0 [16];
  Server *pSStack_1d0;
  Own<capnp::Capability::Server> local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_198;
  long *local_190;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_188;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_150;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_118;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_e0;
  PointerReader local_a8;
  ArrayPtr<const_char> local_88;
  EventLoop local_78;
  Maybe<capnp::MessageSize> local_40;
  Maybe<capnp::MessageSize> local_28;
  
  kj::EventLoop::EventLoop(&local_78);
  local_1e8 = 0xffffffff;
  local_1f0 = &local_78;
  kj::EventLoop::enterScope(&local_78);
  local_264 = 0;
  kj::heap<capnp::_::TestExtendsImpl,int&>((kj *)&local_248,&local_264);
  local_1c8.disposer = local_248.super_PromiseBase.node.disposer;
  local_1c8.ptr = (Server *)(local_248.super_PromiseBase.node.ptr + 2);
  if (local_248.super_PromiseBase.node.ptr == (PromiseNode *)0x0) {
    local_1c8.ptr = (Server *)0x0;
  }
  local_248.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  OVar16 = Capability::Client::makeLocalClient(&local_258,&local_1c8);
  pSVar4 = local_1c8.ptr;
  if (local_1c8.ptr != (Server *)0x0) {
    local_1c8.ptr = (Server *)0x0;
    (*(code *)((Arena *)(local_1c8.disposer)->_vptr_Disposer)->_vptr_Arena)
              (local_1c8.disposer,
               (_func_int *)((long)&pSVar4->_vptr_Server + (long)pSVar4->_vptr_Server[-2]),
               OVar16.ptr);
  }
  pPVar2 = local_248.super_PromiseBase.node.ptr;
  local_260 = &capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  if ((CapTableReader *)local_248.super_PromiseBase.node.ptr != (CapTableReader *)0x0) {
    local_248.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (*(code *)((Arena *)(local_248.super_PromiseBase.node.disposer)->_vptr_Disposer)->_vptr_Arena)
              (local_248.super_PromiseBase.node.disposer,
               pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  __n = (pointer_____offset_0x10___)((long)&local_260 + (long)local_260[-4]);
  (**(code **)(**(long **)(__n + *(long *)(*(long *)((long)&local_260 + (long)local_260[-4]) + -0x18
                                          ) + 8) + 0x20))(&local_200);
  local_208 = &Capability::Client::typeinfo;
  (**(code **)(*local_1f8 + 0x20))(&local_1c8);
  local_1e0._8_8_ = local_1c8.disposer;
  pSStack_1d0 = local_1c8.ptr;
  local_1e0._0_8_ = &capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  local_28.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_e0,(Client *)local_1e0,&local_28);
  *(undefined4 *)local_e0.super_Builder._builder.data = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_150,(int)&local_e0,__buf,(size_t)__n,in_R8D);
  local_40.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            (&local_118,(Client *)local_1e0,&local_40);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send(&local_188,(int)&local_118,__buf_00,(size_t)__n,in_R8D);
  if ((local_264 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_1c8.disposer = (Disposer *)((ulong)local_1c8.disposer & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,99,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_1c8,&local_264);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)&local_1c8,
             &local_188);
  reader._reader.capTable = (CapTableReader *)local_1c8.ptr;
  reader._reader.segment = (SegmentReader *)local_1c8.disposer;
  reader._reader.data = (void *)local_1b8;
  reader._reader.pointers = (WirePointer *)uStack_1b0;
  reader._reader.dataSize = (undefined4)local_1a8;
  reader._reader.pointerCount = local_1a8._4_2_;
  reader._reader._38_2_ = local_1a8._6_2_;
  reader._reader._40_8_ = uStack_1a0;
  checkTestMessage(reader);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (&local_248,&local_150);
  local_a8.capTable = (CapTableReader *)local_248.super_PromiseBase.node.ptr;
  local_a8.pointer = local_230;
  local_a8.segment = (SegmentReader *)local_248.super_PromiseBase.node.disposer;
  local_a8.nestingLimit = local_220;
  if (local_224 == 0) {
    local_a8.capTable = (CapTableReader *)0x0;
    local_a8.pointer = (WirePointer *)0x0;
    local_a8.segment = (SegmentReader *)0x0;
    local_a8.nestingLimit = 0x7fffffff;
  }
  RVar17 = PointerReader::getBlob<capnp::Text>(&local_a8,(void *)0x0,0);
  pSVar12 = (SegmentReader *)local_248.super_PromiseBase.node.disposer;
  pWVar13 = local_230;
  iVar14 = local_220;
  pSVar9 = local_a8.segment;
  pWVar10 = local_a8.pointer;
  iVar11 = local_a8.nestingLimit;
  if (((RVar17.super_StringPtr.content.size_ != 4) ||
      (iVar15 = bcmp(RVar17.super_StringPtr.content.ptr,"bar",3), pSVar9 = local_a8.segment,
      pWVar10 = local_a8.pointer, iVar11 = local_a8.nestingLimit,
      pSVar12 = (SegmentReader *)local_248.super_PromiseBase.node.disposer, pWVar13 = local_230,
      iVar14 = local_220, iVar15 != 0)) &&
     (local_a8.nestingLimit = iVar14, local_a8.pointer = pWVar13, local_a8.segment = pSVar12,
     kj::_::Debug::minSeverity < 3)) {
    local_a8.capTable = (CapTableReader *)local_248.super_PromiseBase.node.ptr;
    if (local_224 == 0) {
      local_a8.nestingLimit = 0x7fffffff;
      local_a8.pointer = (WirePointer *)0x0;
      local_a8.segment = (SegmentReader *)0x0;
      local_a8.capTable = (CapTableReader *)0x0;
    }
    local_88 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_a8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x6b,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response1.getX())\", \"bar\", response1.getX()"
               ,(char (*) [47])"failed: expected (\"bar\") == (response1.getX())",
               (char (*) [4])0x502717,(Reader *)&local_88);
    pSVar9 = local_a8.segment;
    pWVar10 = local_a8.pointer;
    iVar11 = local_a8.nestingLimit;
  }
  local_a8.nestingLimit = iVar11;
  local_a8.pointer = pWVar10;
  local_a8.segment = pSVar9;
  if ((local_264 != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_a8.segment = (SegmentReader *)CONCAT44(local_a8.segment._4_4_,2);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x6d,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)&local_a8,&local_264);
  }
  plVar3 = local_210;
  if (local_210 != (long *)0x0) {
    local_210 = (long *)0x0;
    (**(code **)*local_218)(local_218,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_190;
  if (local_190 != (long *)0x0) {
    local_190 = (long *)0x0;
    (**(code **)*local_198)(local_198,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  pDVar7 = local_188.hook.disposer;
  uVar6 = local_188.super_Builder._builder._32_8_;
  if (local_188.super_Builder._builder._32_8_ != 0) {
    local_188.super_Builder._builder.dataSize = 0;
    local_188.super_Builder._builder.pointerCount = 0;
    local_188.super_Builder._builder._38_2_ = 0;
    local_188.hook.disposer = (Disposer *)0x0;
    (**(local_188.hook.ptr)->_vptr_RequestHook)(local_188.hook.ptr,uVar6,8,pDVar7,pDVar7,0);
  }
  pWVar10 = local_188.super_Builder._builder.pointers;
  if (local_188.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_188.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_188.super_Builder._builder.data)
              (local_188.super_Builder._builder.data,
               (long)&(pWVar10->offsetAndKind).value + *(long *)((long)*pWVar10 + -0x10));
  }
  pCVar5 = local_188.super_Builder._builder.capTable;
  if (local_188.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_188.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_188.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_188.super_Builder._builder.segment,
      (pCVar5->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar5->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar8 = local_118.hook.ptr;
  if (local_118.hook.ptr != (RequestHook *)0x0) {
    local_118.hook.ptr = (RequestHook *)0x0;
    (**(local_118.hook.disposer)->_vptr_Disposer)
              (local_118.hook.disposer,
               pRVar8->_vptr_RequestHook[-2] + (long)&pRVar8->_vptr_RequestHook);
  }
  pDVar7 = local_150.hook.disposer;
  uVar6 = local_150.super_Builder._builder._32_8_;
  if (local_150.super_Builder._builder._32_8_ != 0) {
    local_150.super_Builder._builder.dataSize = 0;
    local_150.super_Builder._builder.pointerCount = 0;
    local_150.super_Builder._builder._38_2_ = 0;
    local_150.hook.disposer = (Disposer *)0x0;
    (**(local_150.hook.ptr)->_vptr_RequestHook)(local_150.hook.ptr,uVar6,8,pDVar7,pDVar7,0);
  }
  pWVar10 = local_150.super_Builder._builder.pointers;
  if (local_150.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_150.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_150.super_Builder._builder.data)
              (local_150.super_Builder._builder.data,
               (long)&(pWVar10->offsetAndKind).value + *(long *)((long)*pWVar10 + -0x10));
  }
  pCVar5 = local_150.super_Builder._builder.capTable;
  if (local_150.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_150.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_150.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_150.super_Builder._builder.segment,
      (pCVar5->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar5->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar8 = local_e0.hook.ptr;
  if (local_e0.hook.ptr != (RequestHook *)0x0) {
    local_e0.hook.ptr = (RequestHook *)0x0;
    (**(local_e0.hook.disposer)->_vptr_Disposer)
              (local_e0.hook.disposer,
               pRVar8->_vptr_RequestHook[-2] + (long)&pRVar8->_vptr_RequestHook);
  }
  pSVar4 = pSStack_1d0;
  if (pSStack_1d0 != (Server *)0x0) {
    pSStack_1d0 = (Server *)0x0;
    (*(code *)(*(Arena **)local_1e0._8_8_)->_vptr_Arena)
              (local_1e0._8_8_,
               (_func_int *)((long)&pSVar4->_vptr_Server + (long)pSVar4->_vptr_Server[-2]));
  }
  plVar3 = local_1f8;
  if (local_1f8 != (long *)0x0) {
    local_1f8 = (long *)0x0;
    (**(code **)*local_200)(local_200,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  pCVar1 = local_258.hook.ptr;
  if (local_258.hook.ptr != (ClientHook *)0x0) {
    local_258.hook.ptr = (ClientHook *)0x0;
    (**(local_258.hook.disposer)->_vptr_Disposer)
              (local_258.hook.disposer,
               pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook);
  }
  kj::EventLoop::leaveScope(local_1f0);
  kj::EventLoop::~EventLoop(&local_78);
  return;
}

Assistant:

TEST(Capability, Inheritance) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  test::TestExtends::Client client1(kj::heap<TestExtendsImpl>(callCount));
  test::TestInterface::Client client2 = client1;
  auto client = client2.castAs<test::TestExtends>();

  auto request1 = client.fooRequest();
  request1.setI(321);
  auto promise1 = request1.send();

  auto request2 = client.graultRequest();
  auto promise2 = request2.send();

  EXPECT_EQ(0, callCount);

  auto response2 = promise2.wait(waitScope);

  checkTestMessage(response2);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("bar", response1.getX());

  EXPECT_EQ(2, callCount);
}